

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

LY_ERR lysp_ext_children_dup(ly_ctx *ctx,lysp_stmt *orig_child,lysp_stmt **child)

{
  LY_VALUE_FORMAT format;
  lysp_stmt *plVar1;
  LY_ERR LVar2;
  lysp_stmt *str_p;
  lysp_stmt *plVar3;
  
  if (*child != (lysp_stmt *)0x0) {
    __assert_fail("!*child",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                  ,0x1ae,
                  "LY_ERR lysp_ext_children_dup(const struct ly_ctx *, const struct lysp_stmt *, struct lysp_stmt **)"
                 );
  }
  plVar3 = (lysp_stmt *)0x0;
  while( true ) {
    if (orig_child == (lysp_stmt *)0x0) {
      return LY_SUCCESS;
    }
    plVar1 = *child;
    str_p = (lysp_stmt *)calloc(1,0x38);
    if (plVar1 == (lysp_stmt *)0x0) {
      *child = str_p;
    }
    else {
      plVar3->next = str_p;
    }
    if (str_p == (lysp_stmt *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_ext_children_dup");
      return LY_EMEM;
    }
    LVar2 = lydict_dup(ctx,orig_child->stmt,(char **)str_p);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    str_p->flags = orig_child->flags;
    LVar2 = lydict_dup(ctx,orig_child->arg,&str_p->arg);
    if (LVar2 != LY_SUCCESS) break;
    format = orig_child->format;
    str_p->format = format;
    LVar2 = ly_dup_prefix_data(ctx,format,orig_child->prefix_data,&str_p->prefix_data);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    str_p->kw = orig_child->kw;
    LVar2 = lysp_ext_children_dup(ctx,orig_child->child,&str_p->child);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    orig_child = orig_child->next;
    plVar3 = str_p;
  }
  return LVar2;
}

Assistant:

static LY_ERR
lysp_ext_children_dup(const struct ly_ctx *ctx, const struct lysp_stmt *orig_child, struct lysp_stmt **child)
{
    struct lysp_stmt *ch = NULL;

    assert(!*child);

    LY_LIST_FOR(orig_child, orig_child) {
        /* new child */
        if (!*child) {
            *child = ch = calloc(1, sizeof *ch);
            LY_CHECK_ERR_RET(!ch, LOGMEM(ctx), LY_EMEM);
        } else {
            ch->next = calloc(1, sizeof *ch);
            LY_CHECK_ERR_RET(!ch->next, LOGMEM(ctx), LY_EMEM);
            ch = ch->next;
        }

        /* fill */
        DUP_STRING_RET(ctx, orig_child->stmt, ch->stmt);
        ch->flags = orig_child->flags;
        DUP_STRING_RET(ctx, orig_child->arg, ch->arg);
        ch->format = orig_child->format;
        LY_CHECK_RET(ly_dup_prefix_data(ctx, orig_child->format, orig_child->prefix_data, &(ch->prefix_data)));
        ch->kw = orig_child->kw;

        /* recursive children */
        LY_CHECK_RET(lysp_ext_children_dup(ctx, orig_child->child, &ch->child));
    }

    return LY_SUCCESS;
}